

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O3

void __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::SetAdj
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  pointer pvVar1;
  pointer puVar2;
  iterator __position;
  long lVar3;
  unsigned_long uVar4;
  unsigned_long *index;
  pointer puVar5;
  unsigned_long local_38;
  
  this_00 = &this->adj_;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(this_00,(this->adj_).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,this->num_variables);
  lVar3 = this->num_interactions_;
  if (0 < lVar3) {
    uVar4 = 0;
    do {
      pvVar1 = (this->poly_key_list_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = pvVar1[uVar4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = *(pointer *)
                ((long)&pvVar1[uVar4].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (puVar5 != puVar2) {
        do {
          this_01 = (this_00->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + *puVar5;
          __position._M_current =
               (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_38 = uVar4;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(this_01,__position,&local_38);
          }
          else {
            *__position._M_current = uVar4;
            (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar2);
        lVar3 = this->num_interactions_;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < lVar3);
  }
  return;
}

Assistant:

void SetAdj() {
    adj_.clear();
    adj_.resize(num_variables);
    for (int64_t i = 0; i < num_interactions_; ++i) {
      for (const auto &index : poly_key_list_[i]) {
        adj_[index].push_back(i);
      }
    }
  }